

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

bool __thiscall
testing::
PolymorphicMatcher<testing::internal::TrulyMatcher<(anonymous_namespace)::first_elements_are>_>::
MonomorphicImpl<const_std::vector<char,_std::allocator<char>_>_&>::MatchAndExplain
          (MonomorphicImpl<const_std::vector<char,_std::allocator<char>_>_&> *this,
          vector<char,_std::allocator<char>_> *x,MatchResultListener *listener)

{
  bool bVar1;
  MatchResultListener *listener_local;
  vector<char,_std::allocator<char>_> *x_local;
  MonomorphicImpl<const_std::vector<char,_std::allocator<char>_>_&> *this_local;
  
  bVar1 = internal::TrulyMatcher<(anonymous_namespace)::first_elements_are>::
          MatchAndExplain<std::vector<char,std::allocator<char>>const>(&this->impl_,x,listener);
  return bVar1;
}

Assistant:

bool MatchAndExplain(T x, MatchResultListener* listener) const override {
      return impl_.MatchAndExplain(x, listener);
    }